

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.h
# Opt level: O0

void __thiscall chain_of_responsibility::IWorker::IWorker(IWorker *this)

{
  IWorker *this_local;
  
  this->_vptr_IWorker = (_func_int **)&PTR___cxa_pure_virtual_0019e950;
  std::shared_ptr<chain_of_responsibility::IWorker>::shared_ptr(&this->next_worker_);
  std::__cxx11::string::string((string *)&this->name_);
  return;
}

Assistant:

IWorker::IWorker(/* args */) {}